

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

float __thiscall nv::FloatImage::sampleLinearMirror(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  float __x;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  fVar15 = (float)uVar1 * x;
  __x = (float)uVar2 * y;
  uVar5 = (uint)fVar15;
  uVar10 = -uVar5;
  if (0 < (int)uVar5) {
    uVar10 = uVar5;
  }
  uVar9 = (uint)uVar1;
  if (uVar1 <= uVar10) {
    do {
      uVar10 = ((uint)uVar1 * 2 + -2) - uVar10;
    } while ((int)uVar9 <= (int)uVar10);
  }
  uVar4 = (uint)__x;
  uVar7 = -uVar4;
  if (0 < (int)uVar4) {
    uVar7 = uVar4;
  }
  uVar11 = (uint)uVar2;
  if (uVar2 <= uVar7) {
    do {
      uVar7 = ((uint)uVar2 * 2 + -2) - uVar7;
    } while ((int)uVar11 <= (int)uVar7);
  }
  uVar5 = uVar5 + 1;
  uVar6 = -uVar5;
  if (0 < (int)uVar5) {
    uVar6 = uVar5;
  }
  if (uVar9 <= uVar6) {
    do {
      uVar6 = ((uint)uVar1 * 2 + -2) - uVar6;
    } while ((int)uVar9 <= (int)uVar6);
  }
  uVar4 = uVar4 + 1;
  uVar5 = -uVar4;
  if (0 < (int)uVar4) {
    uVar5 = uVar4;
  }
  if (uVar11 <= uVar5) {
    do {
      uVar5 = ((uint)uVar2 * 2 + -2) - uVar5;
    } while ((int)uVar11 <= (int)uVar5);
  }
  fVar13 = floorf(__x);
  fVar14 = floorf(fVar15);
  fVar15 = fVar15 - fVar14;
  pfVar3 = this->m_mem;
  iVar8 = (uVar7 + uVar11 * c) * uVar9;
  iVar12 = (uVar11 * c + uVar5) * uVar9;
  return ((1.0 - fVar15) * pfVar3[uVar10 + iVar12] + fVar15 * pfVar3[iVar12 + uVar6]) *
         (__x - fVar13) +
         (1.0 - (__x - fVar13)) *
         (pfVar3[iVar8 + uVar10] * (1.0 - fVar15) + pfVar3[iVar8 + uVar6] * fVar15);
}

Assistant:

float FloatImage::sampleLinearMirror(float x, float y, int c) const
{
	const int w = m_width;
	const int h = m_height;

	x *= w;
	y *= h;

	const float fracX = frac(x);
	const float fracY = frac(y);

	int ix0 = mirror(iround(x), w);
	int iy0 = mirror(iround(y), h);
	int ix1 = mirror(iround(x) + 1, w);
	int iy1 = mirror(iround(y) + 1, h);

	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}